

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_nop_absolute_x_instructions.cpp
# Opt level: O0

int anon_unknown.dwarf_184d01::NopAbsoluteXFixture_nop_absx_Test::AddToRegistry(void)

{
  UnitTest *this;
  ParameterizedTestSuiteRegistry *this_00;
  ParameterizedTestSuiteInfo<(anonymous_namespace)::NopAbsoluteXFixture> *this_01;
  TestMetaFactoryBase<unsigned_char> *meta_factory;
  allocator<char> local_b1;
  string local_b0;
  CodeLocation local_90;
  allocator<char> local_51;
  string local_50;
  CodeLocation local_30;
  
  this = testing::UnitTest::GetInstance();
  this_00 = testing::UnitTest::parameterized_test_registry(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,
             "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu_nop_absolute_x_instructions.cpp"
             ,&local_51);
  testing::internal::CodeLocation::CodeLocation(&local_30,&local_50,0xf);
  this_01 = testing::internal::ParameterizedTestSuiteRegistry::
            GetTestSuitePatternHolder<(anonymous_namespace)::NopAbsoluteXFixture>
                      (this_00,"NopAbsoluteXFixture",&local_30);
  meta_factory = (TestMetaFactoryBase<unsigned_char> *)operator_new(8);
  testing::internal::TestMetaFactory<(anonymous_namespace)::NopAbsoluteXFixture_nop_absx_Test>::
  TestMetaFactory((TestMetaFactory<(anonymous_namespace)::NopAbsoluteXFixture_nop_absx_Test> *)
                  meta_factory);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu_nop_absolute_x_instructions.cpp"
             ,&local_b1);
  testing::internal::CodeLocation::CodeLocation(&local_90,&local_b0,0xf);
  testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::NopAbsoluteXFixture>::
  AddTestPattern(this_01,"NopAbsoluteXFixture","nop_absx",meta_factory,&local_90);
  testing::internal::CodeLocation::~CodeLocation(&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  testing::internal::CodeLocation::~CodeLocation(&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  return 0;
}

Assistant:

TEST_P(NopAbsoluteXFixture, nop_absx) {
    stage_instruction(GetParam());
    expected.pc += 2;

    EXPECT_CALL(mmu, read_byte(registers.pc + 1)).WillOnce(Return(0x34));
    EXPECT_CALL(mmu, read_byte(registers.pc + 2)).WillOnce(Return(0x12));

    step_execution(4);
    EXPECT_EQ(expected, registers);
}